

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O1

void * cab_read_ahead_cfdata(archive_read *a,ssize_t *avail)

{
  lzx_br *br;
  z_streamp strm;
  lzx_stream *strm_00;
  char cVar1;
  undefined1 uVar2;
  short sVar3;
  ushort uVar4;
  ushort uVar5;
  wchar_t wVar6;
  uint uVar7;
  long lVar8;
  int *piVar9;
  int *piVar10;
  undefined4 *puVar11;
  long lVar12;
  bool bVar13;
  uint uVar14;
  uint uVar15;
  byte bVar16;
  wchar_t wVar17;
  int iVar18;
  uint uVar19;
  wchar_t wVar20;
  wchar_t wVar21;
  void *pvVar22;
  void *pvVar23;
  int64_t iVar24;
  void *pvVar25;
  uint uVar26;
  int iVar27;
  int iVar28;
  ulong uVar29;
  long lVar30;
  ulong uVar31;
  undefined4 uVar32;
  ulong uVar33;
  char *pcVar34;
  undefined4 uVar35;
  undefined1 *puVar36;
  ulong uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uchar *p;
  int iVar41;
  int *piVar42;
  uint uVar43;
  undefined1 *__dest;
  size_t __n;
  void *pvVar44;
  wchar_t wVar45;
  ssize_t bytes_avail;
  ssize_t bytes_avail_1;
  uint local_164;
  uint local_158;
  uint local_150;
  uint local_13c;
  lzx_br local_d8 [5];
  ulong local_88;
  byte *local_80;
  long local_78;
  ulong local_70;
  uint local_68;
  int local_64;
  long local_60;
  long local_58;
  long local_50;
  undefined4 *local_48;
  size_t local_40;
  long local_38;
  
  pvVar22 = a->format->data;
  wVar17 = cab_next_cfdata(a);
  if (wVar17 < L'\0') {
    *avail = (long)wVar17;
    return (void *)0x0;
  }
  lVar8 = *(long *)((long)pvVar22 + 0x28);
  sVar3 = *(short *)(lVar8 + 6);
  if (sVar3 == 3) {
    pvVar22 = a->format->data;
    lVar8 = *(long *)((long)pvVar22 + 0x38);
    if (*(long *)((long)pvVar22 + 0xa0) == 0) {
      *(undefined8 *)((long)pvVar22 + 0xa8) = 0x8000;
      pvVar23 = malloc(0x8000);
      *(void **)((long)pvVar22 + 0xa0) = pvVar23;
      if (pvVar23 == (void *)0x0) {
        pcVar34 = "No memory for CAB reader";
        iVar18 = 0xc;
        goto LAB_003f7dae;
      }
    }
    uVar4 = *(ushort *)(lVar8 + 0xc);
    uVar29 = (ulong)uVar4;
    if (uVar4 == *(ushort *)(lVar8 + 8)) {
      uVar4 = *(ushort *)(lVar8 + 0xe);
      lVar8 = *(long *)((long)pvVar22 + 0xa0);
      *avail = uVar29 - uVar4;
      return (void *)((ulong)uVar4 + lVar8);
    }
    if (*(char *)(*(long *)((long)pvVar22 + 0x28) + 0x5c) != '\0') {
LAB_003f66ee:
      lVar30 = *(long *)((long)pvVar22 + 0x1b8);
      *(undefined4 *)(lVar30 + 0x70) = 0;
      *(undefined1 *)(lVar30 + 0x75) = 0;
      *(ulong *)((long)pvVar22 + 0x1b0) = uVar29;
      uVar31 = (ulong)*(ushort *)(lVar8 + 8);
      if (uVar4 < *(ushort *)(lVar8 + 8)) {
        strm_00 = (lzx_stream *)((long)pvVar22 + 0x188);
LAB_003f6721:
        *(ulong *)((long)pvVar22 + 0x1a0) = uVar29 + *(long *)((long)pvVar22 + 0xa0);
        *(ulong *)((long)pvVar22 + 0x1a8) = uVar31 - uVar29;
        local_80 = (byte *)__archive_read_ahead(a,1,(ssize_t *)&local_70);
        if (0 < (long)local_70) {
          uVar29 = (ulong)*(ushort *)(lVar8 + 6);
          if ((long)uVar29 < (long)local_70) {
            local_70 = uVar29;
          }
          uVar31 = local_70;
          *(byte **)((long)pvVar22 + 0x188) = local_80;
          *(ulong *)((long)pvVar22 + 400) = local_70;
          *(undefined8 *)((long)pvVar22 + 0x198) = 0;
          piVar9 = *(int **)((long)pvVar22 + 0x1b8);
          uVar43 = piVar9[0x87];
          if (uVar43 == 0) {
            iVar18 = piVar9[0x1c];
            if ((0 < (long)local_70 && *(char *)((long)piVar9 + 0x75) != '\0') &&
                iVar18 + -0x41 < -0x10) {
              *(ulong *)(piVar9 + 0x1a) =
                   (ulong)*(byte *)(piVar9 + 0x1d) |
                   (ulong)*local_80 << 8 | *(long *)(piVar9 + 0x1a) << 0x10;
              *(byte **)((long)pvVar22 + 0x188) = local_80 + 1;
              *(ulong *)((long)pvVar22 + 400) = local_70 - 1;
              piVar9[0x1c] = iVar18 + 0x10;
              *(undefined1 *)((long)piVar9 + 0x75) = 0;
            }
            iVar18 = (uint)(local_70 == uVar29) * 4 + 1;
            local_68 = (local_70 == uVar29) + 7;
LAB_003f6866:
            if (*piVar9 < 0x12) {
              piVar10 = *(int **)((long)pvVar22 + 0x1b8);
              br = (lzx_br *)(piVar10 + 0x1a);
switchD_003f6891_default:
              switch(*piVar10) {
              case 0:
                if (((piVar10[0x1c] < 1) && (wVar17 = lzx_br_fillup(strm_00,br), wVar17 == L'\0'))
                   && (piVar10[0x1c] < 1)) {
                  *piVar10 = 0;
                  goto LAB_003f789b;
                }
                *(bool *)(piVar10 + 10) =
                     (*(ulong *)(piVar10 + 0x1a) >> ((ulong)(piVar10[0x1c] - 1U) & 0x3f) & 1) != 0;
                piVar10[0x1c] = piVar10[0x1c] - 1U;
                break;
              case 2:
                goto switchD_003f6891_caseD_2;
              case 3:
                goto switchD_003f6891_caseD_3;
              case 4:
                goto switchD_003f6891_caseD_4;
              case 5:
              case 6:
              case 7:
                goto switchD_003f6891_caseD_5;
              case 8:
                goto switchD_003f6891_caseD_8;
              case 9:
                goto switchD_003f6891_caseD_9;
              case 10:
                if (((SBORROW4(piVar10[0x1c],piVar10[0x1e] * 3) !=
                      piVar10[0x1c] + piVar10[0x1e] * -3 < 0) &&
                    (wVar17 = lzx_br_fillup(strm_00,br), wVar17 == L'\0')) &&
                   (SBORROW4(piVar10[0x1c],piVar10[0x1e] * 3) !=
                    piVar10[0x1c] + piVar10[0x1e] * -3 < 0)) {
                  *piVar10 = 10;
                  goto LAB_003f789b;
                }
                piVar10[0x2b] = 0;
                piVar10[0x2c] = 0;
                piVar10[0x2d] = 0;
                piVar10[0x2e] = 0;
                piVar10[0x27] = 0;
                piVar10[0x28] = 0;
                piVar10[0x29] = 0;
                piVar10[0x2a] = 0;
                piVar10[0x23] = 0;
                piVar10[0x24] = 0;
                piVar10[0x25] = 0;
                piVar10[0x26] = 0;
                piVar10[0x1f] = 0;
                piVar10[0x20] = 0;
                piVar10[0x21] = 0;
                piVar10[0x22] = 0;
                piVar10[0x2f] = 0;
                if (0 < piVar10[0x1e]) {
                  lVar30 = 0;
                  do {
                    *(byte *)(*(long *)(piVar10 + 0x30) + lVar30) =
                         (byte)(*(ulong *)(piVar10 + 0x1a) >> ((char)piVar10[0x1c] - 3U & 0x3f)) & 7
                    ;
                    piVar10[(ulong)*(byte *)(*(long *)(piVar10 + 0x30) + lVar30) + 0x1f] =
                         piVar10[(ulong)*(byte *)(*(long *)(piVar10 + 0x30) + lVar30) + 0x1f] + 1;
                    piVar10[0x1c] = piVar10[0x1c] + -3;
                    lVar30 = lVar30 + 1;
                  } while (lVar30 < piVar10[0x1e]);
                }
                wVar17 = lzx_make_huffman_table((huffman *)(piVar10 + 0x1e));
                if (wVar17 == L'\0') goto LAB_003f78a7;
switchD_003f6891_caseD_b:
                piVar10[0x86] = 0;
switchD_003f6891_caseD_c:
                wVar17 = lzx_read_pre_tree(strm_00);
                if (wVar17 == L'\0') {
                  *piVar10 = 0xc;
                  goto LAB_003f789b;
                }
                wVar17 = lzx_make_huffman_table((huffman *)(piVar10 + 0x6c));
                if (wVar17 == L'\0') goto LAB_003f78a7;
                piVar10[0x86] = 0;
switchD_003f6891_caseD_d:
                wVar17 = lzx_read_bitlen(strm_00,(huffman *)(piVar10 + 0x52),L'Ā');
                if (wVar17 < L'\0') goto LAB_003f78a7;
                if (wVar17 == L'\0') {
                  *piVar10 = 0xd;
                  goto LAB_003f789b;
                }
                piVar10[0x86] = 0;
switchD_003f6891_caseD_e:
                wVar17 = lzx_read_pre_tree(strm_00);
                if (wVar17 == L'\0') {
                  *piVar10 = 0xe;
                  goto LAB_003f789b;
                }
                wVar17 = lzx_make_huffman_table((huffman *)(piVar10 + 0x6c));
                if (wVar17 == L'\0') goto LAB_003f78a7;
                piVar10[0x86] = 0x100;
switchD_003f6891_caseD_f:
                wVar17 = lzx_read_bitlen(strm_00,(huffman *)(piVar10 + 0x52),L'\xffffffff');
                if (wVar17 < L'\0') goto LAB_003f78a7;
                if (wVar17 == L'\0') {
                  *piVar10 = 0xf;
                  goto LAB_003f789b;
                }
                wVar17 = lzx_make_huffman_table((huffman *)(piVar10 + 0x52));
                if (wVar17 == L'\0') goto LAB_003f78a7;
                piVar10[0x86] = 0;
switchD_003f6891_caseD_10:
                wVar17 = lzx_read_pre_tree(strm_00);
                if (wVar17 == L'\0') {
                  *piVar10 = 0x10;
                  goto LAB_003f789b;
                }
                wVar17 = lzx_make_huffman_table((huffman *)(piVar10 + 0x6c));
                if (wVar17 == L'\0') goto LAB_003f78a7;
                piVar10[0x86] = 0;
switchD_003f6891_caseD_11:
                wVar17 = lzx_read_bitlen(strm_00,(huffman *)(piVar10 + 0x38),L'\xffffffff');
                if (wVar17 < L'\0') goto LAB_003f78a7;
                if (wVar17 == L'\0') {
                  *piVar10 = 0x11;
                  goto LAB_003f789b;
                }
                wVar17 = lzx_make_huffman_table((huffman *)(piVar10 + 0x38));
                if (wVar17 == L'\0') goto LAB_003f78a7;
                *piVar10 = 0x12;
                uVar43 = 100;
                goto LAB_003f792f;
              case 0xb:
                goto switchD_003f6891_caseD_b;
              case 0xc:
                goto switchD_003f6891_caseD_c;
              case 0xd:
                goto switchD_003f6891_caseD_d;
              case 0xe:
                goto switchD_003f6891_caseD_e;
              case 0xf:
                goto switchD_003f6891_caseD_f;
              case 0x10:
                goto switchD_003f6891_caseD_10;
              case 0x11:
                goto switchD_003f6891_caseD_11;
              default:
                goto switchD_003f6891_default;
              }
              if ((char)piVar10[10] != '\0') {
                if (((piVar10[0x1c] < 0x20) && (wVar17 = lzx_br_fillup(strm_00,br), wVar17 == L'\0')
                    ) && (piVar10[0x1c] < 0x20)) {
                  *piVar10 = 1;
                  goto LAB_003f789b;
                }
                iVar28 = piVar10[0x1c] + -0x20;
                piVar10[9] = (uint)(*(ulong *)(piVar10 + 0x1a) >> ((byte)iVar28 & 0x3f)) & 0xffff |
                             (int)(*(ulong *)(piVar10 + 0x1a) >>
                                  ((char)piVar10[0x1c] - 0x10U & 0x3f)) << 0x10;
                piVar10[0x1c] = iVar28;
              }
switchD_003f6891_caseD_2:
              if (((piVar10[0x1c] < 3) && (wVar17 = lzx_br_fillup(strm_00,br), wVar17 == L'\0')) &&
                 (piVar10[0x1c] < 3)) {
                *piVar10 = 2;
                goto LAB_003f789b;
              }
              bVar16 = (byte)(*(ulong *)(piVar10 + 0x1a) >> ((byte)(piVar10[0x1c] + -3) & 0x3f)) & 7
              ;
              *(byte *)((long)piVar10 + 0x29) = bVar16;
              piVar10[0x1c] = piVar10[0x1c] + -3;
              if (2 < (byte)(bVar16 - 1)) goto LAB_003f78a7;
switchD_003f6891_caseD_3:
              if (((piVar10[0x1c] < 0x18) && (wVar17 = lzx_br_fillup(strm_00,br), wVar17 == L'\0'))
                 && (piVar10[0x1c] < 0x18)) {
                *piVar10 = 3;
                goto LAB_003f789b;
              }
              iVar28 = piVar10[0x1c] + -0x18;
              uVar37 = *(ulong *)(piVar10 + 0x1a) >> ((byte)iVar28 & 0x3f) & 0xffff |
                       (ulong)(((uint)(*(ulong *)(piVar10 + 0x1a) >>
                                      ((char)piVar10[0x1c] - 8U & 0x3f)) & 0xff) << 0x10);
              *(ulong *)(piVar10 + 0xc) = uVar37;
              piVar10[0x1c] = iVar28;
              if (uVar37 == 0) goto LAB_003f78a7;
              *(ulong *)(piVar10 + 0xe) = uVar37;
              iVar28 = 0xb;
              if (*(char *)((long)piVar10 + 0x29) != '\x01') {
                if (*(char *)((long)piVar10 + 0x29) == '\x03') goto switchD_003f6891_caseD_4;
                iVar28 = 10;
              }
              *piVar10 = iVar28;
              goto switchD_003f6891_default;
            }
            local_38 = *(long *)((long)pvVar22 + 0x1a8);
            puVar11 = *(undefined4 **)((long)pvVar22 + 0x1b8);
            local_48 = puVar11 + 0x1a;
            local_d8[0].cache_buffer = *(uint64_t *)(puVar11 + 0x1a);
            local_d8[0].cache_avail = puVar11[0x1c];
            local_d8[0]._12_4_ = puVar11[0x1d];
            local_58 = *(long *)(puVar11 + 0x18);
            __dest = *(undefined1 **)((long)pvVar22 + 0x1a0);
            puVar36 = __dest + local_38;
            lVar30 = *(long *)(puVar11 + 4);
            local_60 = *(long *)(puVar11 + 0x30);
            local_50 = *(long *)(puVar11 + 0x4a);
            lVar12 = *(long *)(puVar11 + 100);
            uVar37 = *(ulong *)(puVar11 + 0xe);
            local_78 = (long)(int)puVar11[0x32];
            wVar17 = puVar11[0x4c];
            wVar6 = puVar11[0x66];
            uVar38 = puVar11[8];
            cVar1 = *(char *)((long)puVar11 + 0x29);
            uVar39 = puVar11[6];
            uVar7 = puVar11[2];
            local_64 = puVar11[1];
            uVar19 = puVar11[0x15];
            local_88 = (ulong)(uint)puVar11[0x17];
            local_158 = puVar11[0x16];
            local_164 = puVar11[0x10];
            uVar32 = *puVar11;
            uVar43 = puVar11[7];
            uVar26 = puVar11[0x12];
            uVar14 = puVar11[0x11];
switchD_003f6b10_default:
            local_150 = uVar14;
            local_13c = uVar26;
            uVar40 = uVar43;
            uVar35 = uVar32;
            uVar15 = local_164;
            uVar32 = uVar35;
            uVar43 = uVar40;
            uVar26 = local_13c;
            uVar14 = local_150;
            switch(uVar35) {
            case 0x12:
              while( true ) {
                if (uVar37 == 0) {
                  *puVar11 = 2;
                  local_d8[0].cache_buffer._4_4_ = (undefined4)(local_d8[0].cache_buffer >> 0x20);
                  *local_48 = (int)local_d8[0].cache_buffer;
                  local_48[1] = local_d8[0].cache_buffer._4_4_;
                  local_48[2] = local_d8[0].cache_avail;
                  local_48[3] = local_d8[0]._12_4_;
                  *(undefined8 *)(puVar11 + 0xe) = 0;
                  puVar11[8] = uVar38;
                  puVar11[7] = uVar40;
                  puVar11[0x15] = uVar19;
                  puVar11[0x16] = local_158;
                  puVar11[0x10] = local_164;
                  puVar11[0x11] = local_150;
                  puVar11[0x12] = local_13c;
                  puVar11[6] = uVar39;
                  *(long *)((long)pvVar22 + 0x1a8) = (long)puVar36 - (long)__dest;
                  uVar43 = 1;
                  goto LAB_003f790d;
                }
                if (puVar36 <= __dest) goto LAB_003f725b;
                if (((local_d8[0].cache_avail < wVar6) &&
                    (wVar45 = lzx_br_fillup(strm_00,local_d8), wVar45 == L'\0')) &&
                   (local_d8[0].cache_avail < wVar6)) {
                  if (uVar31 != uVar29) goto LAB_003f725b;
                  uVar4 = *(ushort *)
                           (*(long *)(puVar11 + 0x6a) +
                           (ulong)((uint)(local_d8[0].cache_buffer <<
                                         ((char)wVar6 - (char)local_d8[0].cache_avail & 0x3fU)) &
                                  cache_masks[wVar6]) * 2);
                  uVar33 = (ulong)uVar4;
                  if ((int)puVar11[0x52] <= (int)(uint)uVar4) {
                    uVar33 = 0;
                  }
                  local_d8[0].cache_avail =
                       local_d8[0].cache_avail - (uint)*(byte *)(lVar12 + uVar33);
                  if (local_d8[0].cache_avail < L'\0') goto LAB_003f78f8;
                }
                else {
                  uVar4 = *(ushort *)
                           (*(long *)(puVar11 + 0x6a) +
                           (ulong)((uint)(local_d8[0].cache_buffer >>
                                         ((char)local_d8[0].cache_avail - (char)wVar6 & 0x3fU)) &
                                  cache_masks[wVar6]) * 2);
                  uVar33 = (ulong)uVar4;
                  if ((int)puVar11[0x52] <= (int)(uint)uVar4) {
                    uVar33 = 0;
                  }
                  local_d8[0].cache_avail =
                       local_d8[0].cache_avail - (uint)*(byte *)(lVar12 + uVar33);
                }
                uVar43 = (uint)uVar33;
                if (0xff < uVar43) break;
                *(char *)(lVar30 + (int)uVar39) = (char)uVar33;
                uVar39 = uVar39 + 1 & uVar7;
                *__dest = (char)uVar33;
                __dest = __dest + 1;
                uVar37 = uVar37 - 1;
              }
              uVar19 = uVar43 & 7;
              local_158 = uVar43 - 0x100 >> 3;
              break;
            case 0x13:
              break;
            case 0x14:
              goto LAB_003f6e27;
            case 0x15:
              goto switchD_003f6b10_caseD_15;
            case 0x16:
              goto switchD_003f6b10_caseD_16;
            default:
              goto switchD_003f6b10_default;
            }
            if (uVar19 == 7) {
              if (((wVar17 <= local_d8[0].cache_avail) ||
                  (wVar45 = lzx_br_fillup(strm_00,local_d8), wVar45 != L'\0')) ||
                 (wVar17 <= local_d8[0].cache_avail)) {
                uVar4 = *(ushort *)
                         (*(long *)(puVar11 + 0x50) +
                         (ulong)((uint)(local_d8[0].cache_buffer >>
                                       ((char)local_d8[0].cache_avail - (char)wVar17 & 0x3fU)) &
                                cache_masks[wVar17]) * 2);
                uVar33 = (ulong)uVar4;
                if ((int)puVar11[0x38] <= (int)(uint)uVar4) {
                  uVar33 = 0;
                }
                iVar28 = (int)uVar33;
                local_d8[0].cache_avail =
                     local_d8[0].cache_avail - (uint)*(byte *)(local_50 + uVar33);
LAB_003f6d8b:
                uVar38 = iVar28 + 9;
                goto LAB_003f6d8e;
              }
              if (uVar31 != uVar29) {
                uVar35 = 0x13;
                uVar19 = 7;
                goto LAB_003f725b;
              }
              uVar4 = *(ushort *)
                       (*(long *)(puVar11 + 0x50) +
                       (ulong)((uint)(local_d8[0].cache_buffer <<
                                     ((char)wVar17 - (char)local_d8[0].cache_avail & 0x3fU)) &
                              cache_masks[wVar17]) * 2);
              uVar33 = (ulong)uVar4;
              if ((int)puVar11[0x38] <= (int)(uint)uVar4) {
                uVar33 = 0;
              }
              iVar28 = (int)uVar33;
              local_d8[0].cache_avail = local_d8[0].cache_avail - (uint)*(byte *)(local_50 + uVar33)
              ;
              if (L'\xffffffff' < local_d8[0].cache_avail) goto LAB_003f6d8b;
            }
            else {
              uVar38 = uVar19 + 2;
LAB_003f6d8e:
              if ((ulong)(long)(int)uVar38 <= uVar37) goto code_r0x003f6d9f;
            }
            goto LAB_003f78f8;
          }
          goto LAB_003f7950;
        }
        pcVar34 = "Truncated CAB file data";
        goto LAB_003f7f31;
      }
LAB_003f79a0:
      if (*(short *)(lVar8 + 6) == 0) {
LAB_003f79f1:
        if ((10 < (ulong)*(ushort *)(lVar8 + 8)) &&
           (lVar30 = *(long *)((long)pvVar22 + 0x1b8), *(char *)(lVar30 + 0x28) != '\0')) {
          pvVar23 = *(void **)((long)pvVar22 + 0xa0);
          pvVar44 = (void *)((long)pvVar23 + ((ulong)*(ushort *)(lVar8 + 8) - 10));
          if (pvVar23 < pvVar44) {
            iVar18 = *(int *)(*(long *)((long)pvVar22 + 0x28) + 0x58);
            pvVar25 = pvVar23;
            do {
              pvVar25 = memchr(pvVar25,0xe8,(long)pvVar44 - (long)pvVar25);
              if (pvVar25 == (void *)0x0) break;
              iVar28 = ((int)pvVar23 - (int)pvVar25) + iVar18 * -0x8000 + 0x8000;
              uVar38 = (uint)*(byte *)((long)pvVar25 + 4) << 0x18;
              uVar43 = (uint)*(byte *)((long)pvVar25 + 2) << 8 |
                       (uint)*(byte *)((long)pvVar25 + 3) << 0x10 |
                       (uint)*(byte *)((long)pvVar25 + 1) | uVar38;
              if ((iVar28 <= (int)uVar43) &&
                 (iVar27 = *(int *)(lVar30 + 0x24), (int)uVar43 < iVar27)) {
                if ((int)uVar38 < 0) {
                  iVar28 = iVar27;
                }
                *(uint *)((long)pvVar25 + 1) = iVar28 + uVar43;
              }
              pvVar25 = (void *)((long)pvVar25 + 5);
            } while (pvVar25 < pvVar44);
          }
        }
        uVar4 = *(ushort *)(lVar8 + 0xe);
        lVar30 = *(long *)((long)pvVar22 + 0xa0);
        *avail = (uVar29 & 0xffff) - (ulong)uVar4;
        *(short *)(lVar8 + 0xc) = (short)uVar29;
        return (void *)(lVar30 + (ulong)uVar4);
      }
      pvVar23 = __archive_read_ahead(a,(ulong)*(ushort *)(lVar8 + 6),(ssize_t *)local_d8);
      if ((long)local_d8[0].cache_buffer < 1) {
        pcVar34 = "Truncated CAB header";
LAB_003f7f31:
        archive_set_error(&a->archive,0x54,pcVar34);
      }
      else {
        *(ulong *)(lVar8 + 0x10) = (ulong)*(ushort *)(lVar8 + 6);
        *(void **)(lVar8 + 0x38) = pvVar23;
        iVar24 = cab_minimum_consume_cfdata(a,(ulong)*(ushort *)(lVar8 + 6));
        if (-1 < iVar24) goto LAB_003f79f1;
      }
LAB_003f7f58:
      *avail = -0x1e;
LAB_003f7ebd:
      return (void *)0x0;
    }
    uVar5 = *(ushort *)(*(long *)((long)pvVar22 + 0x28) + 8);
    if (*(long *)((long)pvVar22 + 0x1b8) == 0) {
      pvVar23 = calloc(1,0x220);
      *(void **)((long)pvVar22 + 0x1b8) = pvVar23;
      if (pvVar23 != (void *)0x0) goto LAB_003f7b94;
    }
    else {
LAB_003f7b94:
      puVar11 = *(undefined4 **)((long)pvVar22 + 0x1b8);
      puVar11[0x87] = 0xffffffe7;
      if (0xfffffff8 < uVar5 - 0x16) {
        puVar11[0x87] = 0xffffffe2;
        iVar18 = puVar11[1];
        uVar43 = slots[uVar5 - 0xf];
        iVar28 = 1 << ((byte)uVar5 & 0x1f);
        puVar11[1] = iVar28;
        puVar11[2] = iVar28 + -1;
        if ((*(void **)(puVar11 + 4) == (void *)0x0) || (iVar18 != iVar28)) {
          free(*(void **)(puVar11 + 4));
          pvVar23 = malloc((long)(int)puVar11[1]);
          *(void **)(puVar11 + 4) = pvVar23;
          if (pvVar23 != (void *)0x0) {
            free(*(void **)(puVar11 + 0x18));
            pvVar23 = malloc((long)(int)uVar43 * 8);
            *(void **)(puVar11 + 0x18) = pvVar23;
            if (pvVar23 != (void *)0x0) {
              free(*(void **)(puVar11 + 100));
              free(*(void **)(puVar11 + 0x6a));
              goto LAB_003f7c44;
            }
          }
        }
        else {
LAB_003f7c44:
          lVar30 = 0;
          do {
            *(int *)((long)&local_d8[0].cache_buffer + lVar30 * 4) = 1 << ((byte)lVar30 & 0x1f);
            lVar30 = lVar30 + 1;
          } while (lVar30 != 0x12);
          lVar30 = *(long *)(puVar11 + 0x18);
          uVar31 = 1;
          if (1 < (int)uVar43) {
            uVar31 = (ulong)uVar43;
          }
          uVar37 = 0;
          uVar39 = 0;
          uVar38 = 0;
          do {
            if (uVar39 == 0) {
              uVar38 = (uint)uVar37;
            }
            else {
              uVar38 = uVar38 + *(int *)((long)&local_d8[0].cache_buffer + (ulong)uVar39 * 4);
            }
            if (uVar39 < 0x11) {
              uVar39 = 0xfffffffe;
              uVar7 = uVar38;
              if (uVar38 != 0) {
                do {
                  uVar39 = uVar39 + 1;
                  bVar13 = 1 < uVar7;
                  uVar7 = (int)uVar7 >> 1;
                } while (bVar13);
              }
              if ((int)uVar39 < 1) {
                uVar39 = 0;
              }
            }
            *(uint *)(lVar30 + uVar37 * 8) = uVar38;
            *(uint *)(lVar30 + 4 + uVar37 * 8) = uVar39;
            uVar37 = uVar37 + 1;
          } while (uVar37 != uVar31);
          puVar11[6] = 0;
          *puVar11 = 0;
          *(undefined8 *)(puVar11 + 0x1a) = 0;
          puVar11[0x1c] = 0;
          puVar11[0x12] = 1;
          *(undefined8 *)(puVar11 + 0x10) = 0x100000001;
          wVar17 = lzx_huffman_init((huffman *)(puVar11 + 0x1e),8,L'\b');
          if ((((wVar17 == L'\0') &&
               (wVar17 = lzx_huffman_init((huffman *)(puVar11 + 0x6c),0x14,L'\n'), wVar17 == L'\0'))
              && (wVar17 = lzx_huffman_init((huffman *)(puVar11 + 0x52),
                                            (long)(int)(uVar43 * 8 + 0x100),L'\x10'),
                 wVar17 == L'\0')) &&
             (wVar17 = lzx_huffman_init((huffman *)(puVar11 + 0x38),0xf9,L'\x10'), wVar17 == L'\0'))
          {
            puVar11[0x87] = 0;
            *(undefined1 *)(*(long *)((long)pvVar22 + 0x28) + 0x5c) = 1;
            goto LAB_003f66ee;
          }
        }
      }
    }
    pcVar34 = "Can\'t initialize LZX decompression.";
  }
  else {
    if (sVar3 != 1) {
      if (sVar3 != 0) {
        archive_set_error(&a->archive,0x54,"Unsupported CAB compression : %s",
                          *(undefined8 *)(lVar8 + 0x10));
        *avail = -0x19;
        return (void *)0x0;
      }
      lVar8 = *(long *)((long)a->format->data + 0x38);
      pvVar22 = __archive_read_ahead(a,1,avail);
      if (0 < *avail) {
        if ((long)(ulong)*(ushort *)(lVar8 + 10) < *avail) {
          *avail = (ulong)*(ushort *)(lVar8 + 10);
        }
        *(undefined2 *)(lVar8 + 0xc) = *(undefined2 *)(lVar8 + 8);
        *(ssize_t *)(lVar8 + 0x10) = *avail;
        *(void **)(lVar8 + 0x38) = pvVar22;
        return pvVar22;
      }
      pcVar34 = "Truncated CAB header";
      iVar18 = 0x54;
LAB_003f7dae:
      archive_set_error(&a->archive,iVar18,pcVar34);
      *avail = -0x1e;
      return (void *)0x0;
    }
    pvVar22 = a->format->data;
    lVar8 = *(long *)((long)pvVar22 + 0x38);
    if (*(long *)((long)pvVar22 + 0xa0) == 0) {
      *(undefined8 *)((long)pvVar22 + 0xa8) = 0x8000;
      pvVar23 = malloc(0x8000);
      *(void **)((long)pvVar22 + 0xa0) = pvVar23;
      if (pvVar23 == (void *)0x0) {
        archive_set_error(&a->archive,0xc,"No memory for CAB reader");
        *avail = -0x1e;
        return (void *)0x0;
      }
    }
    uVar4 = *(ushort *)(lVar8 + 0xc);
    if (uVar4 == *(ushort *)(lVar8 + 8)) {
      uVar5 = *(ushort *)(lVar8 + 0xe);
      lVar8 = *(long *)((long)pvVar22 + 0xa0);
      *avail = (ulong)uVar4 - (ulong)uVar5;
      return (void *)((ulong)uVar5 + lVar8);
    }
    if (*(char *)(*(long *)((long)pvVar22 + 0x28) + 0x5c) != '\0') {
LAB_003f647d:
      uVar43 = (uint)(*(short *)(lVar8 + 6) == *(short *)(lVar8 + 4)) * 2;
      strm = (z_streamp)((long)pvVar22 + 0x110);
      *(ulong *)((long)pvVar22 + 0x138) = (ulong)uVar4;
      iVar18 = 0;
LAB_003f64ac:
      uVar29 = *(ulong *)((long)pvVar22 + 0x138);
      uVar4 = *(ushort *)(lVar8 + 8);
      if (uVar29 < uVar4) {
        *(ulong *)((long)pvVar22 + 0x128) = *(long *)((long)pvVar22 + 0xa0) + uVar29;
        *(uint *)((long)pvVar22 + 0x130) = (uint)uVar4 - (int)uVar29;
        pcVar34 = (char *)__archive_read_ahead(a,1,(ssize_t *)local_d8);
        if ((long)local_d8[0].cache_buffer < 1) {
          bVar13 = false;
          archive_set_error(&a->archive,0x54,"Truncated CAB header");
          *avail = -0x1e;
          uVar32 = 1;
        }
        else {
          if ((long)(ulong)*(ushort *)(lVar8 + 6) < (long)local_d8[0].cache_buffer) {
            local_d8[0].cache_buffer = (ulong)*(ushort *)(lVar8 + 6);
          }
          *(char **)((long)pvVar22 + 0x110) = pcVar34;
          *(int *)((long)pvVar22 + 0x118) = (int)local_d8[0].cache_buffer;
          *(undefined8 *)((long)pvVar22 + 0x120) = 0;
          if ((int)uVar43 < 1) {
LAB_003f65d2:
            iVar18 = cm_zlib_inflate(strm,0);
            if (iVar18 == 0) {
              bVar13 = false;
            }
            else {
              uVar32 = 6;
              if (iVar18 != 1) {
LAB_003f6645:
                bVar13 = false;
                goto LAB_003f669d;
              }
              bVar13 = true;
            }
            iVar24 = *(int64_t *)((long)pvVar22 + 0x120);
            *(int64_t *)(lVar8 + 0x10) = iVar24;
            *(char **)(lVar8 + 0x38) = pcVar34;
            iVar24 = cab_minimum_consume_cfdata(a,iVar24);
            if (iVar24 < 0) {
              *avail = -0x1e;
              uVar32 = 1;
            }
            else {
              uVar32 = 0;
            }
          }
          else {
            uVar32 = 4;
            if (0 < (long)local_d8[0].cache_buffer) {
              uVar29 = (ulong)uVar43;
              if ((long)uVar29 < (long)local_d8[0].cache_buffer) {
                if ((uVar43 == 1) && (*pcVar34 != 'K')) {
                  uVar43 = 1;
                }
                else if (*pcVar34 == 'C') {
                  if (pcVar34[1] == 'K') {
                    *(char **)((long)pvVar22 + 0x110) = pcVar34 + uVar29;
                    *(uint *)((long)pvVar22 + 0x118) = (int)local_d8[0].cache_buffer - uVar43;
                    *(ulong *)((long)pvVar22 + 0x120) = uVar29;
                    uVar43 = 0;
                    goto LAB_003f65d2;
                  }
                  goto LAB_003f6645;
                }
              }
              else if (uVar43 == 2) {
                if ((*pcVar34 == 'C') && ((local_d8[0].cache_buffer == 1 || (pcVar34[1] == 'K')))) {
LAB_003f666d:
                  *(uint64_t *)(lVar8 + 0x10) = local_d8[0].cache_buffer;
                  *(char **)(lVar8 + 0x38) = pcVar34;
                  iVar24 = cab_minimum_consume_cfdata(a,local_d8[0].cache_buffer);
                  if (iVar24 < 0) {
                    *avail = -0x1e;
                    uVar32 = 1;
                    bVar13 = false;
                    goto LAB_003f669d;
                  }
                  uVar43 = uVar43 - (int)local_d8[0].cache_buffer;
                  uVar32 = 2;
                }
                else {
                  uVar43 = 2;
                  uVar32 = 4;
                }
              }
              else if (*pcVar34 == 'K') goto LAB_003f666d;
            }
            bVar13 = false;
          }
        }
LAB_003f669d:
        switch(uVar32) {
        case 0:
        case 2:
          goto switchD_003f66b6_caseD_0;
        default:
          goto LAB_003f7ebd;
        case 4:
          archive_set_error(&a->archive,-1,"CFDATA incorrect(no MSZIP signature)");
          *avail = -0x1e;
          return (void *)0x0;
        case 6:
          goto switchD_003f66b6_caseD_6;
        }
      }
      goto LAB_003f7ae8;
    }
    *(undefined8 *)((long)pvVar22 + 0x110) = 0;
    *(undefined4 *)((long)pvVar22 + 0x118) = 0;
    *(undefined8 *)((long)pvVar22 + 0x138) = 0;
    *(undefined8 *)((long)pvVar22 + 0x120) = 0;
    *(undefined8 *)((long)pvVar22 + 0x128) = 0;
    *(undefined4 *)((long)pvVar22 + 0x130) = 0;
    if (*(char *)((long)pvVar22 + 0x180) == '\0') {
      iVar18 = cm_zlib_inflateInit2_((z_streamp)((long)pvVar22 + 0x110),-0xf,"1.2.3",0x70);
    }
    else {
      iVar18 = cm_zlib_inflateReset((z_streamp)((long)pvVar22 + 0x110));
    }
    if (iVar18 == 0) {
      *(undefined1 *)((long)pvVar22 + 0x180) = 1;
      *(undefined1 *)(*(long *)((long)pvVar22 + 0x28) + 0x5c) = 1;
      goto LAB_003f647d;
    }
    pcVar34 = "Can\'t initialize deflate decompression.";
  }
  archive_set_error(&a->archive,-1,pcVar34);
LAB_003f7eb2:
  *avail = -0x1e;
  return (void *)0x0;
switchD_003f6891_caseD_4:
  uVar43 = piVar10[0x1c];
  if ((uVar43 & 0xf) == 0) {
    if ((((int)uVar43 < 0x10) && (wVar17 = lzx_br_fillup(strm_00,br), wVar17 == L'\0')) &&
       (piVar10[0x1c] < 0x10)) {
      *piVar10 = 4;
      goto LAB_003f789b;
    }
    uVar43 = piVar10[0x1c] - 0x10;
  }
  else {
    uVar43 = uVar43 & 0xfffffff0;
  }
  piVar10[0x1c] = uVar43;
  piVar10[0x14] = 0;
  *piVar10 = 5;
switchD_003f6891_caseD_5:
  do {
    iVar28 = piVar10[0x1c];
    if (iVar28 < 0x20) {
      if (0xf < iVar28) {
        uVar37 = br->cache_buffer;
        iVar41 = 2;
        iVar27 = -0x10;
        puVar36 = (undefined1 *)((long)piVar10 + 0x4d);
        piVar42 = piVar10 + 0x13;
        goto LAB_003f73ec;
      }
    }
    else {
      uVar37 = *(ulong *)(piVar10 + 0x1a);
      uVar33 = uVar37 >> ((byte)(iVar28 + -0x10) & 0x3f);
      piVar10[0x1c] = iVar28 + -0x10;
      *(char *)(piVar10 + 0x13) = (char)uVar33;
      *(char *)((long)piVar10 + 0x4d) = (char)(uVar33 >> 8);
      iVar41 = 4;
      iVar27 = -0x20;
      puVar36 = (undefined1 *)((long)piVar10 + 0x4f);
      piVar42 = (int *)((long)piVar10 + 0x4e);
LAB_003f73ec:
      uVar37 = uVar37 >> ((byte)(iVar28 + iVar27) & 0x3f);
      piVar10[0x1c] = iVar28 + iVar27;
      *(char *)piVar42 = (char)uVar37;
      *puVar36 = (char)(uVar37 >> 8);
      piVar10[0x14] = iVar41;
    }
    iVar28 = piVar10[0x14];
    if (((long)iVar28 < 4) && (*(char *)((long)piVar10 + 0x75) != '\0')) {
      piVar10[0x14] = iVar28 + 1;
      *(char *)((long)piVar10 + (long)iVar28 + 0x4c) = (char)piVar10[0x1d];
      *(undefined1 *)((long)piVar10 + 0x75) = 0;
    }
    iVar28 = piVar10[0x14];
    while (iVar28 < 4) {
      iVar27 = iVar18;
      if (*(long *)((long)pvVar22 + 400) < 1) goto LAB_003f7524;
      puVar36 = *(undefined1 **)((long)pvVar22 + 0x188);
      *(undefined1 **)((long)pvVar22 + 0x188) = puVar36 + 1;
      uVar2 = *puVar36;
      piVar10[0x14] = iVar28 + 1;
      *(undefined1 *)((long)piVar10 + (long)iVar28 + 0x4c) = uVar2;
      *(long *)((long)pvVar22 + 400) = *(long *)((long)pvVar22 + 400) + -1;
      iVar28 = piVar10[0x14];
    }
    piVar10[0x14] = 0;
    iVar28 = *piVar10;
    iVar27 = 0;
    if (iVar28 == 7) {
      uVar43 = (uint)*(byte *)((long)piVar10 + 0x4f) << 0x18;
      piVar10[0x12] =
           (uint)*(byte *)((long)piVar10 + 0x4d) << 8 |
           (uint)*(byte *)((long)piVar10 + 0x4e) << 0x10 | (uint)*(byte *)(piVar10 + 0x13) | uVar43;
      iVar28 = 8;
LAB_003f7517:
      if ((int)uVar43 < 0) {
        iVar27 = 5;
      }
      else {
        *piVar10 = iVar28;
      }
    }
    else {
      if (iVar28 == 6) {
        uVar43 = (uint)*(byte *)((long)piVar10 + 0x4f) << 0x18;
        piVar10[0x11] =
             (uint)*(byte *)((long)piVar10 + 0x4d) << 8 |
             (uint)*(byte *)((long)piVar10 + 0x4e) << 0x10 | (uint)*(byte *)(piVar10 + 0x13) |
             uVar43;
        iVar28 = 7;
        goto LAB_003f7517;
      }
      if (iVar28 == 5) {
        uVar43 = (uint)*(byte *)((long)piVar10 + 0x4f) << 0x18;
        piVar10[0x10] =
             (uint)*(byte *)((long)piVar10 + 0x4d) << 8 |
             (uint)*(byte *)((long)piVar10 + 0x4e) << 0x10 | (uint)*(byte *)(piVar10 + 0x13) |
             uVar43;
        iVar28 = 6;
        goto LAB_003f7517;
      }
    }
LAB_003f7524:
    if (iVar27 != 0) goto joined_r0x003f760d;
  } while (*piVar10 != 8);
switchD_003f6891_caseD_8:
  do {
    if (*(long *)(piVar10 + 0xe) == 0) goto switchD_003f6891_caseD_9;
    uVar37 = *(ulong *)((long)pvVar22 + 0x1a8);
    if ((long)uVar37 < 1) {
      iVar27 = 1;
    }
    else {
      uVar33 = *(ulong *)((long)pvVar22 + 400);
      iVar27 = iVar18;
      if (0 < (long)uVar33) {
        uVar38 = (uint)*(long *)(piVar10 + 0xe);
        uVar43 = piVar10[1] - piVar10[6];
        if ((int)uVar38 <= piVar10[1] - piVar10[6]) {
          uVar43 = uVar38;
        }
        if ((long)(int)uVar43 <= (long)uVar37) {
          uVar37 = (ulong)uVar43;
        }
        if ((long)(int)uVar37 <= (long)uVar33) {
          uVar33 = uVar37 & 0xffffffff;
        }
        __n = (size_t)(int)uVar33;
        memcpy(*(void **)((long)pvVar22 + 0x1a0),*(void **)((long)pvVar22 + 0x188),__n);
        memcpy((void *)((long)piVar10[6] + *(long *)(piVar10 + 4)),*(void **)((long)pvVar22 + 0x188)
               ,__n);
        *(long *)((long)pvVar22 + 0x188) = *(long *)((long)pvVar22 + 0x188) + __n;
        *(long *)((long)pvVar22 + 400) = *(long *)((long)pvVar22 + 400) - __n;
        *(long *)((long)pvVar22 + 0x1a0) = *(long *)((long)pvVar22 + 0x1a0) + __n;
        *(long *)((long)pvVar22 + 0x1a8) = *(long *)((long)pvVar22 + 0x1a8) - __n;
        *(long *)((long)pvVar22 + 0x1b0) = *(long *)((long)pvVar22 + 0x1b0) + __n;
        piVar10[6] = piVar10[6] + (int)uVar33 & piVar10[2];
        *(size_t *)(piVar10 + 0xe) = *(long *)(piVar10 + 0xe) - __n;
        iVar27 = 0;
      }
    }
  } while (iVar27 == 0);
joined_r0x003f760d:
  if (iVar27 != 5) {
LAB_003f78b8:
    uVar43 = 0;
    goto LAB_003f792f;
  }
LAB_003f78a7:
  piVar10[0x87] = -0x19;
  uVar43 = 0xffffffe7;
  goto LAB_003f792f;
switchD_003f6891_caseD_9:
  if ((*(byte *)(piVar10 + 0xc) & 1) != 0) {
    if (*(long *)((long)pvVar22 + 400) < 1) {
      *piVar10 = 9;
LAB_003f789b:
      if (uVar31 != uVar29) goto LAB_003f78b8;
      goto LAB_003f78a7;
    }
    *(long *)((long)pvVar22 + 0x188) = *(long *)((long)pvVar22 + 0x188) + 1;
    *(long *)((long)pvVar22 + 400) = *(long *)((long)pvVar22 + 400) + -1;
  }
  *piVar10 = 2;
  uVar43 = 1;
LAB_003f792f:
  if (uVar43 != 100) goto code_r0x003f793d;
  goto LAB_003f6866;
code_r0x003f6d9f:
  uVar32 = 0x15;
  uVar43 = local_164;
  if (local_158 == 0) goto switchD_003f6b10_default;
  if (local_158 == 2) {
    local_158 = 2;
    uVar43 = local_13c;
    uVar26 = local_164;
    local_164 = local_13c;
    goto switchD_003f6b10_default;
  }
  if (local_158 == 1) {
    local_158 = 1;
    uVar43 = local_150;
    uVar14 = local_164;
    local_164 = local_150;
    goto switchD_003f6b10_default;
  }
  local_88 = (ulong)*(uint *)(local_58 + 4 + (long)(int)local_158 * 8);
LAB_003f6e27:
  wVar45 = (wchar_t)local_88;
  if ((cVar1 == '\x02') && (L'\x02' < wVar45)) {
    wVar45 = wVar45 + L'\xfffffffd';
    if (((wVar45 <= local_d8[0].cache_avail) ||
        (wVar20 = lzx_br_fillup(strm_00,local_d8), wVar20 != L'\0')) ||
       (uVar32 = 0x14, uVar43 = local_68, wVar45 <= local_d8[0].cache_avail)) {
      uVar40 = ((uint)(local_d8[0].cache_buffer >>
                      ((char)local_d8[0].cache_avail - (char)wVar45 & 0x3fU)) &
               cache_masks[(uint)wVar45]) * 8;
      wVar20 = (int)local_78 + wVar45;
      uVar32 = uVar35;
      if (((local_d8[0].cache_avail < wVar20) &&
          (wVar21 = lzx_br_fillup(strm_00,local_d8), wVar21 == L'\0')) &&
         (local_d8[0].cache_avail < wVar20)) {
        if (uVar31 == uVar29) {
          uVar4 = *(ushort *)
                   (*(long *)(puVar11 + 0x36) +
                   (ulong)((uint)(local_d8[0].cache_buffer <<
                                 ((char)local_78 - (char)(local_d8[0].cache_avail - wVar45) & 0x3fU)
                                 ) & cache_masks[local_78]) * 2);
          uVar33 = (ulong)uVar4;
          if ((int)puVar11[0x1e] <= (int)(uint)uVar4) {
            uVar33 = 0;
          }
          local_d8[0].cache_avail =
               (local_d8[0].cache_avail - wVar45) - (uint)*(byte *)(local_60 + uVar33);
          if (L'\xffffffff' < local_d8[0].cache_avail) goto LAB_003f70a9;
          uVar43 = 8;
        }
        else {
          uVar43 = 7;
          uVar32 = 0x14;
        }
      }
      else {
        uVar4 = *(ushort *)
                 (*(long *)(puVar11 + 0x36) +
                 (ulong)((uint)(local_d8[0].cache_buffer >>
                               ((char)(local_d8[0].cache_avail - wVar45) - (char)local_78 & 0x3fU))
                        & cache_masks[local_78]) * 2);
        uVar33 = (ulong)uVar4;
        if ((int)puVar11[0x1e] <= (int)(uint)uVar4) {
          uVar33 = 0;
        }
        local_d8[0].cache_avail =
             (local_d8[0].cache_avail - wVar45) - (uint)*(byte *)(local_60 + uVar33);
LAB_003f70a9:
        uVar40 = (int)uVar33 + uVar40;
        uVar43 = 0;
      }
    }
    uVar35 = uVar32;
    if (uVar43 != 0) {
      if (uVar43 == 7) goto LAB_003f725b;
      if (uVar43 != 8) goto LAB_003f790d;
LAB_003f78f8:
      puVar11[0x87] = 0xffffffe7;
      uVar43 = 0xffffffe7;
LAB_003f790d:
      lVar30 = local_38 - *(long *)((long)pvVar22 + 0x1a8);
      *(long *)((long)pvVar22 + 0x1a0) = *(long *)((long)pvVar22 + 0x1a0) + lVar30;
      *(long *)((long)pvVar22 + 0x1b0) = *(long *)((long)pvVar22 + 0x1b0) + lVar30;
      goto LAB_003f792f;
    }
  }
  else {
    if ((local_d8[0].cache_avail < wVar45) &&
       ((wVar45 = lzx_br_fillup(strm_00,local_d8), wVar45 == L'\0' &&
        (local_d8[0].cache_avail < (wchar_t)local_88)))) {
      uVar35 = 0x14;
      if (uVar31 == uVar29) goto LAB_003f78f8;
      goto LAB_003f725b;
    }
    local_d8[0].cache_avail = local_d8[0].cache_avail - (int)local_88;
    uVar40 = (uint)(local_d8[0].cache_buffer >> ((byte)local_d8[0].cache_avail & 0x3f)) &
             cache_masks[(int)local_88];
  }
  uVar40 = (uVar40 + *(int *)(local_58 + (long)(int)local_158 * 8)) - 2;
  local_13c = local_150;
  uVar15 = uVar40;
  local_150 = local_164;
switchD_003f6b10_caseD_15:
  local_164 = uVar15;
  uVar40 = uVar39 - uVar40 & uVar7;
switchD_003f6b10_caseD_16:
  uVar32 = uVar35;
  do {
    uVar43 = uVar39;
    if ((int)uVar39 < (int)uVar40) {
      uVar43 = uVar40;
    }
    uVar26 = local_64 - uVar43;
    if ((int)uVar38 < (int)(local_64 - uVar43)) {
      uVar26 = uVar38;
    }
    if (puVar36 <= __dest + (int)uVar26) {
      uVar26 = (int)puVar36 - (int)__dest;
    }
    pvVar23 = (void *)((int)uVar40 + lVar30);
    if (((int)uVar26 < 8) ||
       (((int)uVar39 <= (int)(uVar40 + uVar26) && ((int)uVar40 <= (int)(uVar39 + uVar26))))) {
      if (0 < (int)uVar26) {
        uVar33 = 0;
        do {
          uVar2 = *(undefined1 *)((long)pvVar23 + uVar33);
          *(undefined1 *)((int)uVar39 + lVar30 + uVar33) = uVar2;
          __dest[uVar33] = uVar2;
          uVar33 = uVar33 + 1;
        } while (uVar26 != uVar33);
      }
    }
    else {
      local_40 = (size_t)uVar26;
      memcpy((void *)((int)uVar39 + lVar30),pvVar23,local_40);
      memcpy(__dest,pvVar23,local_40);
    }
    __dest = __dest + (int)uVar26;
    uVar40 = uVar40 + uVar26 & uVar7;
    uVar39 = uVar39 + uVar26 & uVar7;
    uVar37 = uVar37 - (long)(int)uVar26;
    uVar35 = 0x16;
    if (__dest < puVar36) {
      uVar35 = uVar32;
    }
    iVar28 = 7;
    if (__dest < puVar36) {
      iVar28 = 0;
    }
    uVar14 = uVar26;
    if ((int)uVar38 <= (int)uVar26) {
      uVar35 = uVar32;
      uVar14 = 0;
    }
    uVar43 = 10;
    if ((int)uVar38 <= (int)uVar26) {
      iVar28 = 10;
    }
    uVar38 = uVar38 - uVar14;
    uVar32 = uVar35;
  } while (iVar28 == 0);
  if (iVar28 != 7) {
    if (iVar28 != 10) goto LAB_003f790d;
    uVar32 = 0x12;
    uVar43 = uVar40;
    uVar26 = local_13c;
    uVar14 = local_150;
    goto switchD_003f6b10_default;
  }
LAB_003f725b:
  *local_48 = (int)local_d8[0].cache_buffer;
  local_48[1] = local_d8[0].cache_buffer._4_4_;
  local_48[2] = local_d8[0].cache_avail;
  local_48[3] = local_d8[0]._12_4_;
  *(ulong *)(puVar11 + 0xe) = uVar37;
  puVar11[8] = uVar38;
  puVar11[7] = uVar40;
  puVar11[0x15] = uVar19;
  puVar11[0x17] = (int)local_88;
  puVar11[0x16] = local_158;
  puVar11[0x10] = local_164;
  puVar11[0x11] = local_150;
  puVar11[0x12] = local_13c;
  *puVar11 = uVar35;
  puVar11[6] = uVar39;
  *(long *)((long)pvVar22 + 0x1a8) = (long)puVar36 - (long)__dest;
  uVar43 = 0;
  goto LAB_003f790d;
code_r0x003f793d:
  *(long *)((long)pvVar22 + 0x198) =
       *(long *)((long)pvVar22 + 0x198) + (uVar31 - *(long *)((long)pvVar22 + 400));
LAB_003f7950:
  if (1 < uVar43) {
    archive_set_error(&a->archive,-1,"LZX decompression failed (%d)");
    goto LAB_003f7f58;
  }
  iVar24 = *(int64_t *)((long)pvVar22 + 0x198);
  *(int64_t *)(lVar8 + 0x10) = iVar24;
  *(byte **)(lVar8 + 0x38) = local_80;
  iVar24 = cab_minimum_consume_cfdata(a,iVar24);
  if (iVar24 < 0) goto LAB_003f7f58;
  uVar29 = *(ulong *)((long)pvVar22 + 0x1b0);
  uVar31 = (ulong)*(ushort *)(lVar8 + 8);
  if ((long)uVar31 <= (long)uVar29) goto LAB_003f79a0;
  goto LAB_003f6721;
switchD_003f66b6_caseD_0:
  if (bVar13) goto LAB_003f7ae8;
  goto LAB_003f64ac;
LAB_003f7ae8:
  uVar29 = *(ulong *)((long)pvVar22 + 0x138);
  uVar31 = uVar29 & 0xffff;
  if ((uint)*(ushort *)(lVar8 + 8) <= (uint)uVar31) {
    if (*(short *)(lVar8 + 6) != 0) {
      pvVar23 = __archive_read_ahead(a,(ulong)*(ushort *)(lVar8 + 6),(ssize_t *)local_d8);
      if ((long)local_d8[0].cache_buffer < 1) {
        archive_set_error(&a->archive,0x54,"Truncated CAB header");
        goto LAB_003f7f9f;
      }
      *(ulong *)(lVar8 + 0x10) = (ulong)*(ushort *)(lVar8 + 6);
      *(void **)(lVar8 + 0x38) = pvVar23;
      iVar24 = cab_minimum_consume_cfdata(a,(ulong)*(ushort *)(lVar8 + 6));
      if (iVar24 < 0) goto LAB_003f7f9f;
    }
    if (((int)(uint)*(ushort *)(*(long *)((long)pvVar22 + 0x28) + 4) <=
         *(int *)(*(long *)((long)pvVar22 + 0x28) + 0x58)) ||
       ((iVar18 = cm_zlib_inflateReset(strm), iVar18 == 0 &&
        (iVar18 = cm_zlib_inflateSetDictionary
                            (strm,*(Bytef **)((long)pvVar22 + 0xa0),(uint)*(ushort *)(lVar8 + 8)),
        iVar18 == 0)))) {
      uVar4 = *(ushort *)(lVar8 + 0xe);
      lVar30 = *(long *)((long)pvVar22 + 0xa0);
      *avail = uVar31 - uVar4;
      *(short *)(lVar8 + 0xc) = (short)uVar29;
      return (void *)((ulong)uVar4 + lVar30);
    }
switchD_003f66b6_caseD_6:
    if (iVar18 == -4) {
      archive_set_error(&a->archive,0xc,"Out of memory for deflate decompression");
    }
    else {
      archive_set_error(&a->archive,-1,"Deflate decompression failed (%d)");
    }
LAB_003f7f9f:
    *avail = -0x1e;
    return (void *)0x0;
  }
  archive_set_error(&a->archive,-1,"Invalid uncompressed size (%d < %d)",uVar31);
  goto LAB_003f7eb2;
}

Assistant:

static const void *
cab_read_ahead_cfdata(struct archive_read *a, ssize_t *avail)
{
	struct cab *cab = (struct cab *)(a->format->data);
	int err;

	err = cab_next_cfdata(a);
	if (err < ARCHIVE_OK) {
		*avail = err;
		return (NULL);
	}

	switch (cab->entry_cffolder->comptype) {
	case COMPTYPE_NONE:
		return (cab_read_ahead_cfdata_none(a, avail));
	case COMPTYPE_MSZIP:
		return (cab_read_ahead_cfdata_deflate(a, avail));
	case COMPTYPE_LZX:
		return (cab_read_ahead_cfdata_lzx(a, avail));
	default: /* Unsupported compression. */
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Unsupported CAB compression : %s",
		    cab->entry_cffolder->compname);
		*avail = ARCHIVE_FAILED;
		return (NULL);
	}
}